

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall
cmCTest::SetCTestConfigurationFromCMakeVariable
          (cmCTest *this,cmMakefile *mf,char *dconfig,string *cmake_var,bool suppress)

{
  char *value;
  ostream *poVar1;
  char *msg;
  string local_1e8 [48];
  ostringstream local_1b8 [8];
  ostringstream cmCTestLog_msg;
  char *ctvar;
  bool suppress_local;
  string *cmake_var_local;
  char *dconfig_local;
  cmMakefile *mf_local;
  cmCTest *this_local;
  
  value = cmMakefile::GetDefinition(mf,cmake_var);
  if (value != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar1 = std::operator<<((ostream *)local_1b8,"SetCTestConfigurationFromCMakeVariable:");
    poVar1 = std::operator<<(poVar1,dconfig);
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = std::operator<<(poVar1,(string *)cmake_var);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0xa13,msg,suppress);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
    SetCTestConfiguration(this,dconfig,value,suppress);
  }
  return value != (char *)0x0;
}

Assistant:

bool cmCTest::SetCTestConfigurationFromCMakeVariable(
  cmMakefile* mf, const char* dconfig, const std::string& cmake_var,
  bool suppress)
{
  const char* ctvar;
  ctvar = mf->GetDefinition(cmake_var);
  if (!ctvar) {
    return false;
  }
  cmCTestOptionalLog(this, HANDLER_VERBOSE_OUTPUT,
                     "SetCTestConfigurationFromCMakeVariable:"
                       << dconfig << ":" << cmake_var << std::endl,
                     suppress);
  this->SetCTestConfiguration(dconfig, ctvar, suppress);
  return true;
}